

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<TPZEqnArray<long_double>,_10>::TPZManVector
          (TPZManVector<TPZEqnArray<long_double>,_10> *this,
          TPZManVector<TPZEqnArray<long_double>,_10> *copy)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [16];
  void *pvVar4;
  ulong uVar5;
  long lVar6;
  TPZEqnArray<long_double> *pTVar7;
  TPZEqnArray<long_double> *pTVar8;
  ulong uVar9;
  
  (this->super_TPZVec<TPZEqnArray<long_double>_>).fStore = (TPZEqnArray<long_double> *)0x0;
  (this->super_TPZVec<TPZEqnArray<long_double>_>).fNElements = 0;
  (this->super_TPZVec<TPZEqnArray<long_double>_>).fNAlloc = 0;
  (this->super_TPZVec<TPZEqnArray<long_double>_>)._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_019b6140;
  pTVar8 = (TPZEqnArray<long_double> *)&this->field_0x20;
  lVar6 = 0;
  pTVar7 = pTVar8;
  do {
    TPZEqnArray<long_double>::TPZEqnArray(pTVar7);
    lVar6 = lVar6 + -0x51e0;
    pTVar7 = pTVar7 + 1;
  } while (lVar6 != -0x332c0);
  uVar9 = (copy->super_TPZVec<TPZEqnArray<long_double>_>).fNElements;
  if ((long)uVar9 < 0xb) {
    uVar5 = 0;
  }
  else {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar9;
    uVar5 = 0xffffffffffffffff;
    if (SUB168(auVar3 * ZEXT816(0x51e0),8) == 0) {
      uVar5 = SUB168(auVar3 * ZEXT816(0x51e0),0) | 0x10;
    }
    pvVar4 = operator_new__(uVar5);
    *(ulong *)((long)pvVar4 + 8) = uVar9;
    pTVar8 = (TPZEqnArray<long_double> *)((long)pvVar4 + 0x10);
    lVar6 = 0;
    pTVar7 = pTVar8;
    do {
      TPZEqnArray<long_double>::TPZEqnArray(pTVar7);
      lVar6 = lVar6 + -0x51e0;
      pTVar7 = pTVar7 + 1;
      uVar5 = uVar9;
    } while (uVar9 * -0x51e0 - lVar6 != 0);
  }
  (this->super_TPZVec<TPZEqnArray<long_double>_>).fStore = pTVar8;
  (this->super_TPZVec<TPZEqnArray<long_double>_>).fNElements = uVar9;
  (this->super_TPZVec<TPZEqnArray<long_double>_>).fNAlloc = uVar5;
  if (0 < (long)uVar9) {
    lVar6 = 0;
    do {
      pTVar8 = (copy->super_TPZVec<TPZEqnArray<long_double>_>).fStore;
      pTVar7 = (this->super_TPZVec<TPZEqnArray<long_double>_>).fStore;
      puVar1 = (undefined8 *)
               ((long)(pTVar8->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar6 + -0x28);
      puVar2 = (undefined8 *)
               ((long)(pTVar7->fEqStart).super_TPZManVector<int,_100>.fExtAlloc + lVar6 + -0x28);
      *puVar2 = *puVar1;
      TPZManVector<int,_100>::operator=
                ((TPZManVector<int,_100> *)(puVar2 + 1),(TPZManVector<int,_100> *)(puVar1 + 1));
      TPZManVector<int,_100>::operator=
                ((TPZManVector<int,_100> *)
                 ((long)(pTVar7->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc + lVar6 + -0x20),
                 (TPZManVector<int,_100> *)
                 ((long)(pTVar8->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc + lVar6 + -0x20))
      ;
      TPZManVector<long_double,_1000>::operator=
                ((TPZManVector<long_double,_1000> *)
                 ((long)(pTVar7->fEqValues).super_TPZManVector<long_double,_1000>.fExtAlloc +
                 lVar6 + -0x20),
                 (TPZManVector<long_double,_1000> *)
                 ((long)(pTVar8->fEqValues).super_TPZManVector<long_double,_1000>.fExtAlloc +
                 lVar6 + -0x20));
      TPZManVector<int,_1000>::operator=
                ((TPZManVector<int,_1000> *)
                 ((long)(pTVar7->fIndex).super_TPZManVector<int,_1000>.fExtAlloc + lVar6 + -0x20),
                 (TPZManVector<int,_1000> *)
                 ((long)(pTVar8->fIndex).super_TPZManVector<int,_1000>.fExtAlloc + lVar6 + -0x20));
      *(undefined4 *)((long)&pTVar7->fLastTerm + lVar6) =
           *(undefined4 *)((long)&pTVar8->fLastTerm + lVar6);
      lVar6 = lVar6 + 0x51e0;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(const TPZManVector< T, NumExtAlloc >& copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy.fStore[i];
    }
}